

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O1

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  Allocator *pAVar4;
  int *piVar5;
  void *pvVar6;
  long *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Mat *pMVar10;
  Layer *pLVar11;
  int _elempack;
  ulong uVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  undefined4 *puVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int k;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  undefined4 *puVar25;
  ParamDict pd_5;
  ParamDict pd;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_18c;
  uint local_184;
  Option *local_180;
  void *local_178;
  undefined1 local_170 [16];
  ulong local_160;
  Mat local_158;
  void *local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  ulong local_c0;
  DeformableConv2D_x86 *local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  p_Var2 = this->_vptr_DeformableConv2D_x86[-3];
  local_180 = opt;
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var2)) {
  case 1:
    uStack_190 = 0x56116c;
    pLVar11 = create_layer(0x1a);
    uStack_190 = 0x56117c;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x561188;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 2:
    uStack_190 = 0x561265;
    pLVar11 = create_layer(0x1a);
    uStack_190 = 0x561275;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x56128b;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x561299;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    goto LAB_005612f5;
  case 3:
    uStack_190 = 0x5611cc;
    pLVar11 = create_layer(0x36);
    uStack_190 = 0x5611dc;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5611f2;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x56120e;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    uStack_190 = 0x56121c;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    goto LAB_005612f5;
  case 4:
    uStack_190 = 0x56122b;
    pLVar11 = create_layer(0x1e);
    uStack_190 = 0x56123b;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x561247;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 5:
    uStack_190 = 0x56119c;
    pLVar11 = create_layer(0x47);
    uStack_190 = 0x5611ac;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5611b8;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
    break;
  case 6:
    uStack_190 = 0x5612a5;
    pLVar11 = create_layer(0x43);
    uStack_190 = 0x5612b5;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x5612cb;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x5612e7;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    uStack_190 = 0x5612f5;
    (*pLVar11->_vptr_Layer[2])(pLVar11,&local_158);
LAB_005612f5:
    uStack_190 = 0x5612ff;
    ParamDict::~ParamDict((ParamDict *)&local_158);
    opt = local_180;
    goto LAB_00561309;
  default:
    pLVar11 = (Layer *)0x0;
    goto LAB_00561309;
  }
  opt = local_180;
  uStack_190 = 0x561256;
  ParamDict::~ParamDict((ParamDict *)&local_158);
LAB_00561309:
  if (pLVar11 != (Layer *)0x0) {
    uStack_190 = 0x56131a;
    (*pLVar11->_vptr_Layer[4])(pLVar11,opt);
  }
  this->activation = pLVar11;
  p_Var2 = this->_vptr_DeformableConv2D_x86[-3];
  iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var2);
  lVar21 = (long)iVar20;
  local_178 = (void *)(long)*(int *)(&this->field_0xd8 + (long)p_Var2);
  local_184 = *(int *)(&this->field_0xd8 + (long)p_Var2) * iVar20;
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  local_c0 = (ulong)uVar1;
  uVar12 = (long)*(int *)(&this->field_0x100 + (long)p_Var2) / (long)(int)local_184;
  uVar12 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
  uVar16 = (long)uVar12 / (long)(int)uVar1;
  uStack_18c._4_4_ = (uint)uVar16;
  iVar22 = 1;
  uVar24 = 1;
  if (opt->use_packing_layout == true) {
    uVar24 = (uint)((uVar16 & 3) == 0) * 3 + 1;
    iVar22 = (uint)((uVar1 & 3) == 0) * 3 + 1;
  }
  local_b8 = this;
  if (opt->use_sgemm_convolution == true) {
    uStack_190 = 0x5613b6;
    pLVar11 = create_layer(0x4a);
    this->gemm = pLVar11;
    uStack_190 = 0x5613c7;
    ParamDict::ParamDict((ParamDict *)local_170);
    uStack_190 = 0x5613d6;
    ParamDict::set((ParamDict *)local_170,2,0);
    uStack_190 = 0x5613e7;
    ParamDict::set((ParamDict *)local_170,3,0);
    uStack_190 = 0x5613fb;
    ParamDict::set((ParamDict *)local_170,4,1);
    uStack_190 = 0x56140c;
    ParamDict::set((ParamDict *)local_170,5,0);
    uStack_190 = 0x561420;
    ParamDict::set((ParamDict *)local_170,6,1);
    uStack_190 = 0x56143e;
    ParamDict::set((ParamDict *)local_170,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    uStack_190 = 0x56144f;
    ParamDict::set((ParamDict *)local_170,8,0);
    iVar20 = uStack_18c._4_4_ * local_184;
    uStack_190 = 0x56146b;
    ParamDict::set((ParamDict *)local_170,9,iVar20);
    uStack_190 = 0x561491;
    ParamDict::set((ParamDict *)local_170,10,
                   -(uint)(*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3])
                          == 0) | 1);
    uStack_190 = 0x5614a5;
    ParamDict::set((ParamDict *)local_170,0xb,1);
    uStack_190 = 0x5614b4;
    (*this->gemm->_vptr_Layer[2])(this->gemm,local_170);
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x5614ff;
    Mat::reshape(&local_158,(Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3])
                 ,local_184,uStack_18c._4_4_,
                 (int)((Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3]))[-2]
                      .elemsize,(Allocator *)0x0);
    uStack_190 = 0x561526;
    Mat::create(&local_98,iVar20,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),4,
                (Allocator *)0x0);
    opt = local_180;
    pp_Var3 = this->_vptr_DeformableConv2D_x86;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
      local_178 = local_98.data;
      local_160 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
      ;
      uVar12 = (ulong)uVar24;
      lVar21 = 0;
      do {
        if ((int)uVar24 <= (int)uStack_18c._4_4_) {
          lVar19 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          puVar13 = (undefined4 *)
                    (CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                     local_158.cstep * lVar21 + (long)local_158.data);
          puVar18 = (undefined4 *)(local_160 * lVar21 + (long)local_98.data);
          lVar15 = 0;
          do {
            if (0 < (int)local_184) {
              uVar23 = 0;
              uVar16 = uVar12;
              puVar25 = puVar13;
              puVar14 = puVar13;
              do {
                do {
                  *puVar18 = *puVar25;
                  puVar18 = puVar18 + 1;
                  uVar16 = uVar16 - 1;
                  puVar25 = (undefined4 *)((long)puVar25 + lVar19);
                } while (uVar16 != 0);
                uVar23 = uVar23 + 1;
                puVar25 = puVar14 + 1;
                uVar16 = uVar12;
                puVar14 = puVar25;
              } while (uVar23 != local_184);
            }
            lVar15 = lVar15 + uVar12;
            puVar13 = (undefined4 *)((long)puVar13 + lVar19 * uVar12);
          } while (lVar15 < (long)((long)(int)uStack_18c._4_4_ - (ulong)(uVar24 - 1)));
        }
        lVar21 = lVar21 + 1;
        this = local_b8;
      } while (lVar21 < *(int *)(&local_b8->field_0xd0 + (long)pp_Var3[-3]));
    }
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            uStack_190 = 0x5618cc;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x561644;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3]) == 0) {
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar11 = this->gemm;
      uStack_190 = 0x561cbf;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x561cd0;
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_a8);
      uStack_190 = 0x561cdd;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              uStack_190 = 0x561d1f;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x561d09;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar21 = 0x40;
      do {
        *(undefined8 *)((long)&local_158.data + lVar21) = 0;
        *(undefined8 *)((long)&uStack_198 + lVar21) = 0;
        *(undefined8 *)((long)&stack0xfffffffffffffe70 + lVar21) = 0;
        *(undefined8 *)((long)((long)register0x00000020 + -0x18c) + lVar21) = 0;
        *(undefined8 *)((long)&local_184 + lVar21) = 0;
        *(undefined8 *)(local_170 + lVar21 + -8) = 0;
        *(undefined8 *)(local_170 + lVar21) = 0;
        *(undefined8 *)(local_170 + lVar21 + 4) = 0;
        *(undefined8 *)(local_170 + lVar21 + 0xc) = 0;
        lVar21 = lVar21 + 0x48;
      } while (lVar21 != 0xd0);
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              uStack_190 = 0x5619bf;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x56194b;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      p_Var2 = this->_vptr_DeformableConv2D_x86[-3];
      if (&local_110 != (void **)(&this->field_0x198 + (long)p_Var2)) {
        piVar5 = *(int **)(&this->field_0x1a0 + (long)p_Var2);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = (int *)CONCAT44(uStack_104,uStack_108);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_f0 == (long *)0x0) {
              if (local_110 != (void *)0x0) {
                uStack_190 = 0x561a85;
                free(local_110);
              }
            }
            else {
              uStack_190 = 0x561a76;
              (**(code **)(*local_f0 + 0x18))();
            }
          }
        }
        local_110 = *(void **)(&this->field_0x198 + (long)p_Var2);
        uStack_108 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2);
        uStack_104 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) >> 0x20)
        ;
        uStack_100 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2);
        uStack_fc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2) >> 0x20);
        uStack_f8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var2);
        local_f0 = *(long **)(&this->field_0x1b8 + (long)p_Var2);
        local_e8 = *(undefined8 *)(&this->field_0x1c0 + (long)p_Var2);
        uStack_e0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var2);
        local_d8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var2);
        local_d0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var2);
      }
      pLVar11 = this->gemm;
      uStack_190 = 0x561b2a;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x561b3b;
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_a8);
      uStack_190 = 0x561b48;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar21 = 0x48;
      do {
        piVar5 = *(int **)((long)&local_158.refcount + lVar21);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar6 = *(void **)((long)&local_158.data + lVar21);
            plVar7 = *(long **)((long)&local_158.allocator + lVar21);
            if (plVar7 == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                uStack_190 = 0x561b86;
                free(pvVar6);
              }
            }
            else {
              uStack_190 = 0x561b74;
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar21) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar21 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar21 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar21) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar21) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar21) = 0;
        *(undefined8 *)((long)&local_158.h + lVar21) = 0;
        *(undefined4 *)((long)&local_158.c + lVar21) = 0;
        lVar21 = lVar21 + -0x48;
        opt = local_180;
      } while (lVar21 != -0x48);
    }
    uStack_190 = 0x561bc7;
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            uStack_190 = 0x561c03;
            free(local_98.data);
          }
        }
        else {
          uStack_190 = 0x561bf4;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x561c3e;
    ParamDict::~ParamDict((ParamDict *)local_170);
  }
  else if ((iVar22 == 1) && (uVar24 == 1)) {
    if (p_Var2 != (_func_int *)0xfffffffffffffec0) {
      piVar5 = *(int **)(&this->field_0x158 + (long)p_Var2);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (this->weight_data_tm).refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pvVar6 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar6 != (void *)0x0) {
              uStack_190 = 0x561dd5;
              free(pvVar6);
            }
          }
          else {
            uStack_190 = 0x5616a4;
            (*pAVar4->_vptr_Allocator[3])
                      (pAVar4,pvVar6,(long)uVar12 % (long)(int)uVar1 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar5 = *(int **)((long)(&this->field_0x150 + (long)p_Var2) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var2);
      (this->weight_data_tm).refcount = piVar5;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var2);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var2);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var2);
      uVar8 = *(undefined8 *)(&this->field_0x178 + (long)p_Var2);
      uVar9 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var2) + 8);
      (this->weight_data_tm).dims = (int)uVar8;
      (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).h = (int)uVar9;
      (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var2);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var2);
      opt = local_180;
    }
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = *(undefined4 **)(&this->field_0x150 + (long)p_Var2);
    _elempack = uVar24 * iVar22;
    uStack_190 = 0x5616f3;
    Mat::create(local_48,(int)(uStack_18c._4_4_ * local_184 * uVar1) / _elempack,
                (ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
    pMVar10 = local_48;
    if (0 < (int)uVar1) {
      pvVar6 = (local_b8->weight_data_tm).data;
      lVar15 = (long)(int)uStack_18c._4_4_ * (long)local_178 * lVar21;
      local_40 = lVar15 * 4;
      local_38 = lVar21 * 4;
      local_160 = 0;
      do {
        if (0 < (int)local_178) {
          local_b0 = local_50;
          pvVar17 = (void *)0x0;
          do {
            if (0 < iVar20) {
              lVar19 = 0;
              puVar13 = local_b0;
              do {
                if (0 < (int)uStack_18c._4_4_) {
                  uVar12 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 | local_160 & 0xffffffff;
                  uVar16 = 0;
                  puVar18 = puVar13;
                  do {
                    uVar23 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar6 +
                     (long)(int)((((int)((long)uVar23 / (long)(int)uVar24) +
                                  ((int)lVar19 +
                                  ((int)((long)uVar12 / (long)iVar22) * (int)local_178 +
                                  (int)pvVar17) * iVar20) * (uStack_18c._4_4_ / uVar24)) * uVar24 +
                                 (int)((long)uVar23 % (long)(int)uVar24)) * iVar22 +
                                (int)((long)uVar12 % (long)iVar22)) * 4) = *puVar18;
                    uVar16 = uVar16 + 1;
                    puVar18 = puVar18 + (long)local_178 * lVar21;
                  } while (uStack_18c._4_4_ != uVar16);
                }
                lVar19 = lVar19 + 1;
                puVar13 = puVar13 + 1;
              } while (lVar19 != lVar21);
            }
            pvVar17 = (void *)((long)pvVar17 + 1);
            local_b0 = local_b0 + lVar21;
          } while (pvVar17 != local_178);
        }
        local_160 = local_160 + 1;
        local_50 = local_50 + lVar15;
      } while (local_160 != local_c0);
    }
    uStack_190 = 0x56186a;
    Mat::reshape(&local_158,local_48,(int)uStack_18c._4_4_ / (int)uVar24,local_184,
                 (int)((long)((ulong)(uint)((int)local_c0 >> 0x1f) << 0x20 | local_c0 & 0xffffffff)
                      / (long)iVar22),(Allocator *)0x0);
    this = local_b8;
    opt = local_180;
    if (&local_158 != pMVar10) {
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (local_b8->weight_data_tm).refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pvVar6 = (local_b8->weight_data_tm).data;
          pAVar4 = (local_b8->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar6 != (void *)0x0) {
              uStack_190 = 0x561d31;
              free(pvVar6);
            }
          }
          else {
            uStack_190 = 0x5618ba;
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
      pMVar10->data = (void *)0x0;
      pMVar10->refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).data = local_158.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      (this->weight_data_tm).elemsize =
           CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      (this->weight_data_tm).elempack = local_158.elempack;
      (this->weight_data_tm).allocator = local_158.allocator;
      (this->weight_data_tm).dims = local_158.dims;
      (this->weight_data_tm).w = local_158.w;
      (this->weight_data_tm).h = local_158.h;
      (this->weight_data_tm).d = local_158.d;
      (this->weight_data_tm).c = local_158.c;
      (this->weight_data_tm).cstep = local_158.cstep;
    }
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            uStack_190 = 0x561dc6;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x561db7;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_DeformableConv2D_x86[-3];
    piVar5 = *(int **)(&this->field_0x158 + (long)p_Var2);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x150 + (long)p_Var2) != (void *)0x0) {
            uStack_190 = 0x561e88;
            free(*(void **)(&this->field_0x150 + (long)p_Var2));
          }
        }
        else {
          uStack_190 = 0x561e79;
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}